

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O2

void __thiscall
message_test_should_throw_when_missing_fields_in_repeating_group_Test::TestBody
          (message_test_should_throw_when_missing_fields_in_repeating_group_Test *this)

{
  bool bVar1;
  undefined1 local_55e0 [8];
  MarketDataIncrementalRefresh refresh;
  Instance instance;
  Instance instance2;
  FieldGroup<_fc5f2565_> group;
  AssertHelper local_18;
  
  Fixpp::MessageBase<$fafecb21$>::MessageBase((MessageBase<_fafecb21_> *)local_55e0);
  instance2.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
  super_AlignedCharArray<8UL,_24UL>.buffer._16_8_ =
       Fixpp::createGroup<_3a11739c_>((VersionnedMessage<_16d94feb_> *)local_55e0,1);
  Fixpp::FieldGroup<$fc5f2565$>::instance
            ((Instance *)
             ((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                     Storage.InlineElts + 8) + 0x10),
             (FieldGroup<_fc5f2565_> *)
             ((long)instance2.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                    super_AlignedCharArray<8UL,_24UL>.buffer + 0x10));
  Fixpp::set<_10817cd1_>
            ((InstanceGroup<_7a79f124_> *)
             ((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                     Storage.InlineElts + 8) + 0x10),(char (*) [5])"TEST");
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    Fixpp::FieldGroup<$fc5f2565$>::add
              ((FieldGroup<_fc5f2565_> *)
               ((long)instance2.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                      super_AlignedCharArray<8UL,_24UL>.buffer + 0x10),
               (Instance *)
               ((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                       Storage.InlineElts + 8) + 0x10));
  }
  testing::Message::Message
            ((Message *)
             ((long)instance.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                    super_AlignedCharArray<8UL,_24UL>.buffer + 0x10));
  testing::internal::AssertHelper::AssertHelper
            (&local_18,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
             ,0x5b,
             "Expected: group.add(instance) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=
            (&local_18,
             (Message *)
             ((long)instance.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                    super_AlignedCharArray<8UL,_24UL>.buffer + 0x10));
  testing::internal::AssertHelper::~AssertHelper(&local_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)instance.super_MessageBase<_3080f4d0_>.unparsed.Storage.InlineElts[8].
                          super_AlignedCharArray<8UL,_24UL>.buffer + 0x10));
  Fixpp::MessageBase<$3080f4d0$>::~MessageBase
            ((MessageBase<_3080f4d0_> *)
             ((long)(refresh.super_MessageT<_a6506600_>.super_MessageBase<_fafecb21_>.unparsed.
                     Storage.InlineElts + 8) + 0x10));
  Fixpp::MessageBase<$fafecb21$>::~MessageBase((MessageBase<_fafecb21_> *)local_55e0);
  return;
}

Assistant:

TEST(message_test, should_throw_when_missing_fields_in_repeating_group)
{
    using namespace Fixpp;

    Fixpp::v42::Message::MarketDataIncrementalRefresh refresh;
    auto group = Fixpp::createGroup<Tag::NoMDEntries>(refresh, 1);
    auto instance = group.instance();

    Fixpp::set<Tag::MDEntryID>(instance, "TEST");
    ASSERT_THROW(group.add(instance), std::runtime_error);

    auto instance2 = group.instance();
    Fixpp::set<Tag::MDUpdateAction>(instance2, '0');
    ASSERT_NO_THROW(group.add(instance2));
}